

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O3

shared<boost::ext::di::v1_3_0::scopes::singleton,_impl,_std::shared_ptr<impl>_&> __thiscall
boost::ext::di::v1_3_0::scopes::singleton::
scope_impl<impl,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
create_impl<impl,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<impl,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::concepts::any_of<i1,i2>,impl,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>>
          (scope_impl<impl,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>> *this,
          provider<boost::ext::di::v1_3_0::aux::pair<impl,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::concepts::any_of<i1,_i2>,_impl,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
          *provider)

{
  int iVar1;
  
  if (create_impl<impl,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<impl,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::concepts::any_of<i1,i2>,impl,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>>(boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<impl,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::concepts::any_of<i1,i2>,impl,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>const&)
      ::object == '\0') {
    iVar1 = __cxa_guard_acquire(&create_impl<impl,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<impl,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::concepts::any_of<i1,i2>,impl,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>>(boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<impl,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::concepts::any_of<i1,i2>,impl,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>const&)
                                 ::object);
    if (iVar1 != 0) {
      scope_impl<impl,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_>::
      create_impl<impl,_boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<impl,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::concepts::any_of<i1,_i2>,_impl,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>_>
      ::object.super___shared_ptr<impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)operator_new(0x10);
      ((scope_impl<impl,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_>::
        create_impl<impl,_boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<impl,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::concepts::any_of<i1,_i2>,_impl,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>_>
        ::object.super___shared_ptr<impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_i1)._vptr_i1 =
           (_func_int **)&PTR__impl_00103d00;
      ((scope_impl<impl,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_>::
        create_impl<impl,_boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<impl,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::concepts::any_of<i1,_i2>,_impl,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>_>
        ::object.super___shared_ptr<impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_i2)._vptr_i2 =
           (_func_int **)&PTR__impl_00103d30;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<impl*>
                (&scope_impl<impl,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_>::
                  create_impl<impl,_boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<impl,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::concepts::any_of<i1,_i2>,_impl,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>_>
                  ::object.super___shared_ptr<impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 scope_impl<impl,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_>::
                 create_impl<impl,_boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<impl,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::concepts::any_of<i1,_i2>,_impl,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>_>
                 ::object.super___shared_ptr<impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      __cxa_atexit(std::__shared_ptr<impl,_(__gnu_cxx::_Lock_policy)2>::~__shared_ptr,
                   &scope_impl<impl,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_>::
                    create_impl<impl,_boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<impl,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::concepts::any_of<i1,_i2>,_impl,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>_>
                    ::object,&__dso_handle);
      __cxa_guard_release(&create_impl<impl,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<impl,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::concepts::any_of<i1,i2>,impl,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>>(boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<impl,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::concepts::any_of<i1,i2>,impl,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>const&)
                           ::object);
    }
  }
  return (shared<boost::ext::di::v1_3_0::scopes::singleton,_impl,_std::shared_ptr<impl>_&>)
         &scope_impl<impl,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_>::
          create_impl<impl,_boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<impl,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::concepts::any_of<i1,_i2>,_impl,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>_>
          ::object;
}

Assistant:

auto create_impl(const TProvider& provider) {
      static std::shared_ptr<T_> object{provider.get()};
      return wrappers::shared<singleton, T_, std::shared_ptr<T_>&>{object};
    }